

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_newline.c
# Opt level: O3

BOOL coda__pcre2_is_newline_8
               (PCRE2_SPTR8 ptr,uint32_t type,PCRE2_SPTR8 endptr,uint32_t *lenptr,BOOL utf)

{
  byte bVar1;
  uint32_t uVar2;
  
  bVar1 = *ptr;
  uVar2 = 1;
  if (type == 2) {
    if (bVar1 == 10) goto LAB_0014ad72;
  }
  else {
    if (bVar1 - 10 < 3) goto LAB_0014ad72;
    if (bVar1 == 0x85) {
      uVar2 = 2 - (utf == 0);
      goto LAB_0014ad72;
    }
  }
  if (bVar1 != 0xd) {
    return 0;
  }
  if (ptr < endptr + -1) {
    uVar2 = (ptr[1] == '\n') + 1;
  }
LAB_0014ad72:
  *lenptr = uVar2;
  return 1;
}

Assistant:

BOOL
PRIV(is_newline)(PCRE2_SPTR ptr, uint32_t type, PCRE2_SPTR endptr,
  uint32_t *lenptr, BOOL utf)
{
uint32_t c;

#ifdef SUPPORT_UNICODE
if (utf) { GETCHAR(c, ptr); } else c = *ptr;
#else
(void)utf;
c = *ptr;
#endif  /* SUPPORT_UNICODE */

if (type == NLTYPE_ANYCRLF) switch(c)
  {
  case CHAR_LF:
  *lenptr = 1;
  return TRUE;

  case CHAR_CR:
  *lenptr = (ptr < endptr - 1 && ptr[1] == CHAR_LF)? 2 : 1;
  return TRUE;

  default:
  return FALSE;
  }

/* NLTYPE_ANY */

else switch(c)
  {
#ifdef EBCDIC
  case CHAR_NEL:
#endif
  case CHAR_LF:
  case CHAR_VT:
  case CHAR_FF:
  *lenptr = 1;
  return TRUE;

  case CHAR_CR:
  *lenptr = (ptr < endptr - 1 && ptr[1] == CHAR_LF)? 2 : 1;
  return TRUE;

#ifndef EBCDIC
#if PCRE2_CODE_UNIT_WIDTH == 8
  case CHAR_NEL:
  *lenptr = utf? 2 : 1;
  return TRUE;

  case 0x2028:   /* LS */
  case 0x2029:   /* PS */
  *lenptr = 3;
  return TRUE;

#else  /* 16-bit or 32-bit code units */
  case CHAR_NEL:
  case 0x2028:   /* LS */
  case 0x2029:   /* PS */
  *lenptr = 1;
  return TRUE;
#endif
#endif /* Not EBCDIC */

  default:
  return FALSE;
  }
}